

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

int lj_cf_io_type(lua_State *L)

{
  TValue *pTVar1;
  cTValue *o;
  lua_State *L_local;
  
  pTVar1 = lj_lib_checkany(L,1);
  if (((int)(pTVar1->field_4).it >> 0xf == -0xd) &&
     (*(char *)((pTVar1->u64 & 0x7fffffffffff) + 10) == '\x01')) {
    if (*(long *)((pTVar1->u64 & 0x7fffffffffff) + 0x30) == 0) {
      lua_pushlstring(L,"closed file",0xb);
    }
    else {
      lua_pushlstring(L,"file",4);
    }
  }
  else {
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    pTVar1->u64 = 0xffffffffffffffff;
  }
  return 1;
}

Assistant:

LJLIB_CF(io_type)
{
  cTValue *o = lj_lib_checkany(L, 1);
  if (!(tvisudata(o) && udataV(o)->udtype == UDTYPE_IO_FILE))
    setnilV(L->top++);
  else if (((IOFileUD *)uddata(udataV(o)))->fp != NULL)
    lua_pushliteral(L, "file");
  else
    lua_pushliteral(L, "closed file");
  return 1;
}